

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_bcon_new(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint32_t uVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  bson_t *pbVar15;
  undefined1 *puVar16;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar17;
  bson_t expected;
  undefined8 uStack_6a50;
  uint8_t *puStack_6a48;
  undefined1 *puStack_6a40;
  undefined1 auStack_6a30 [8];
  void *pvStack_6a28;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  char *pcStack_6a08;
  undefined8 uStack_69f0;
  undefined1 auStack_6980 [25944];
  void *pvStack_428;
  char *pcStack_420;
  char *pcStack_418;
  char *pcStack_410;
  code *pcStack_408;
  bson_t bStack_400;
  undefined1 auStack_380 [4];
  uint uStack_37c;
  undefined1 auStack_300 [336];
  void *pvStack_1b0;
  ulong uStack_1a8;
  undefined1 *puStack_1a0;
  ulong uStack_198;
  void *pvStack_190;
  code *pcStack_188;
  undefined1 auStack_180 [4];
  uint local_17c;
  
  puVar16 = auStack_180;
  pcStack_188 = (code *)0x13bf27;
  bson_init(auStack_180);
  pcStack_188 = (code *)0x13bf4e;
  bson_append_utf8(auStack_180,"hello",0xffffffff,"world",0xffffffff);
  pcStack_188 = (code *)0x13bf5f;
  uVar4 = bcon_new(0,"hello","world",0);
  pcStack_188 = (code *)0x13bf6a;
  pvVar5 = (void *)bson_get_data(uVar4);
  pcStack_188 = (code *)0x13bf75;
  pvVar6 = (void *)bson_get_data(auStack_180);
  if (local_17c == *(uint *)(uVar4 + 4)) {
    pcStack_188 = (code *)0x13bf8e;
    pvVar7 = (void *)bson_get_data(auStack_180);
    pcStack_188 = (code *)0x13bf99;
    pvVar8 = (void *)bson_get_data(uVar4);
    pcStack_188 = (code *)0x13bfa9;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)local_17c);
    if (iVar1 == 0) {
      pcStack_188 = (code *)0x13bfb5;
      bson_destroy(uVar4);
      pcStack_188 = (code *)0x13bfbd;
      bson_destroy(auStack_180);
      return;
    }
  }
  pcStack_188 = (code *)0x13bfd6;
  uVar9 = bson_as_canonical_extended_json(uVar4,0);
  pcStack_188 = (code *)0x13bfe6;
  uVar10 = bson_as_canonical_extended_json(auStack_180,0);
  uVar2 = *(uint *)(uVar4 + 4);
  uVar3 = local_17c;
  if (uVar2 < local_17c) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar3 = local_17c;
    if (uVar2 <= local_17c) {
      uVar3 = uVar2;
    }
    uVar12 = 0;
    do {
      if (*(char *)((long)pvVar5 + uVar12) != *(char *)((long)pvVar6 + uVar12)) {
        uVar12 = uVar12 & 0xffffffff;
        goto LAB_0013c020;
      }
      uVar12 = uVar12 + 1;
    } while (uVar3 != (uint)uVar12);
  }
  if (uVar2 < local_17c) {
    uVar2 = local_17c;
  }
  uVar12 = (ulong)(uVar2 - 1);
LAB_0013c020:
  pcStack_188 = (code *)0x13c03e;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar12,uVar9,uVar10);
  pcStack_188 = (code *)0x13c056;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_188 = (code *)0x13c071;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c0b9:
    pcStack_188 = (code *)0x13c0be;
    test_bcon_new_cold_5();
LAB_0013c0be:
    pcStack_188 = (code *)0x13c0c3;
    test_bcon_new_cold_4();
LAB_0013c0c3:
    pcStack_188 = (code *)0x13c0c8;
    test_bcon_new_cold_1();
  }
  else {
    puVar16 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c0be;
    uVar4 = (ulong)*(uint *)(uVar4 + 4);
    pcStack_188 = (code *)0x13c091;
    uVar12 = write(uVar2,pvVar5,uVar4);
    if (uVar12 != uVar4) goto LAB_0013c0c3;
    uVar4 = (ulong)local_17c;
    pcStack_188 = (code *)0x13c0a9;
    uVar12 = write(uVar3,pvVar6,uVar4);
    if (uVar12 == uVar4) {
      pcStack_188 = (code *)0x13c0b9;
      test_bcon_new_cold_3();
      goto LAB_0013c0b9;
    }
  }
  pcStack_188 = test_append_ctx;
  test_bcon_new_cold_2();
  pbVar15 = &bStack_400;
  pcStack_408 = (code *)0x13c0ed;
  pvStack_1b0 = pvVar6;
  uStack_1a8 = (ulong)uVar2;
  puStack_1a0 = puVar16;
  uStack_198 = uVar4;
  pvStack_190 = pvVar5;
  pcStack_188 = (code *)&stack0xfffffffffffffff8;
  bson_init(&bStack_400);
  pcStack_408 = (code *)0x13c0fd;
  bson_init(auStack_380);
  pcStack_408 = (code *)0x13c10d;
  bson_init(auStack_300);
  pcStack_408 = (code *)0x13c12e;
  bson_append_utf8(auStack_300,"c",0xffffffff,"d",0xffffffff);
  pcStack_408 = (code *)0x13c155;
  bson_append_utf8(auStack_300,"e",0xffffffff,"f",0xffffffff);
  pcStack_408 = (code *)0x13c16f;
  bson_append_document(auStack_380,"a",0xffffffff,auStack_300);
  pcVar14 = "e";
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = "f";
  pvStack_428 = (void *)0x13c1a4;
  test_append_ctx_helper(&bStack_400,"a","{",0,"add magic");
  pcStack_408 = (code *)0x13c1b3;
  pvVar5 = (void *)bson_get_data(&bStack_400);
  pcStack_408 = (code *)0x13c1be;
  pvVar6 = (void *)bson_get_data(auStack_380);
  if (uStack_37c == bStack_400.len) {
    pcStack_408 = (code *)0x13c1dc;
    pvVar7 = (void *)bson_get_data(auStack_380);
    pcStack_408 = (code *)0x13c1e7;
    pvVar8 = (void *)bson_get_data(&bStack_400);
    pcStack_408 = (code *)0x13c1f6;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_37c);
    if (iVar1 == 0) {
      pcStack_408 = (code *)0x13c202;
      bson_destroy(&bStack_400);
      pcStack_408 = (code *)0x13c20f;
      bson_destroy(auStack_380);
      pcStack_408 = (code *)0x13c21c;
      bson_destroy(auStack_300);
      return;
    }
  }
  pcStack_408 = (code *)0x13c238;
  uVar9 = bson_as_canonical_extended_json(&bStack_400,0);
  pcStack_408 = (code *)0x13c24d;
  uVar10 = bson_as_canonical_extended_json(auStack_380,0);
  uVar11 = uStack_37c;
  if (bStack_400.len < uStack_37c) {
    uVar11 = bStack_400.len;
  }
  if (uVar11 != 0) {
    uVar11 = uStack_37c;
    if (bStack_400.len <= uStack_37c) {
      uVar11 = bStack_400.len;
    }
    uVar4 = 0;
    do {
      if (*(char *)((long)pvVar5 + uVar4) != *(char *)((long)pvVar6 + uVar4)) {
        uVar4 = uVar4 & 0xffffffff;
        goto LAB_0013c288;
      }
      uVar4 = uVar4 + 1;
    } while (uVar11 != (uint)uVar4);
  }
  uVar2 = bStack_400.len;
  if (bStack_400.len < uStack_37c) {
    uVar2 = uStack_37c;
  }
  uVar4 = (ulong)(uVar2 - 1);
LAB_0013c288:
  pcStack_408 = (code *)0x13c2a6;
  uVar17 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar4);
  pcStack_408 = (code *)0x13c2be;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar13 = "failure.expected.bson";
  pvVar7 = (void *)0x42;
  pcStack_408 = (code *)0x13c2d9;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c325:
    pcStack_408 = (code *)0x13c32a;
    test_append_ctx_cold_5();
LAB_0013c32a:
    pcStack_408 = (code *)0x13c32f;
    test_append_ctx_cold_4();
  }
  else {
    pbVar15 = (bson_t *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c32a;
    pcVar13 = (char *)(ulong)uVar2;
    pcStack_408 = (code *)0x13c2fa;
    pvVar7 = pvVar5;
    uVar4 = write(uVar2,pvVar5,(ulong)bStack_400.len);
    if (uVar4 == bStack_400.len) {
      pvVar5 = (void *)(ulong)uStack_37c;
      pcStack_408 = (code *)0x13c315;
      pvVar7 = pvVar6;
      pcVar13 = (char *)pbVar15;
      pvVar8 = (void *)write(uVar3,pvVar6,(size_t)pvVar5);
      if (pvVar8 != pvVar5) goto LAB_0013c334;
      pvVar7 = (void *)(ulong)uVar3;
      pcStack_408 = (code *)0x13c325;
      pcVar13 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013c325;
    }
  }
  pcStack_408 = (code *)0x13c334;
  test_append_ctx_cold_1();
LAB_0013c334:
  pcStack_408 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_6a40 = auStack_6a30;
  if (extraout_AL != '\0') {
    uStack_69f0 = uVar17;
  }
  pvStack_6a28 = pvVar7;
  uStack_6a18 = uVar9;
  uStack_6a10 = uVar10;
  pcStack_6a08 = pcVar14;
  pvStack_428 = pvVar6;
  pcStack_420 = (char *)pbVar15;
  pcStack_418 = (char *)pvVar5;
  pcStack_410 = (char *)(ulong)uVar2;
  pcStack_408 = (code *)&pcStack_188;
  bcon_append_ctx_init(auStack_6980);
  puStack_6a48 = bStack_400.padding;
  uStack_6a50 = 0x3000000008;
  bcon_append_ctx_va(pcVar13,auStack_6980,&uStack_6a50);
  if ((uint)uStack_6a50 < 0x29) {
    uStack_6a50 = CONCAT44(uStack_6a50._4_4_,(uint)uStack_6a50 + 8);
  }
  else {
    puStack_6a48 = puStack_6a48 + 8;
  }
  bcon_append_ctx(pcVar13,auStack_6980,"c","d",0);
  bcon_append_ctx_va(pcVar13,auStack_6980,&uStack_6a50);
  return;
}

Assistant:

static void
test_bcon_new (void)
{
   bson_t expected;
   bson_t *bcon;

   bson_init (&expected);

   bson_append_utf8 (&expected, "hello", -1, "world", -1);
   bcon = BCON_NEW ("hello", "world");

   bson_eq_bson (bcon, &expected);

   bson_destroy (bcon);
   bson_destroy (&expected);
}